

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O2

CP_DP_Interface LoadMpiDP(void)

{
  LoadMpiDP::mpiDPInterface.DPName = "mpi";
  return &LoadMpiDP::mpiDPInterface;
}

Assistant:

extern CP_DP_Interface LoadMpiDP()
{
    static struct _CP_DP_Interface mpiDPInterface = {
        .ReaderContactFormats = MpiReaderContactStructs,
        .WriterContactFormats = MpiWriterContactStructs,
        .initReader = MpiInitReader,
        .initWriter = MpiInitWriter,
        .initWriterPerReader = MpiInitWriterPerReader,
        .provideWriterDataToReader = MpiProvideWriterDataToReader,
        .readRemoteMemory = (CP_DP_ReadRemoteMemoryFunc)MpiReadRemoteMemory,
        .waitForCompletion = MpiWaitForCompletion,
        .provideTimestep = (CP_DP_ProvideTimestepFunc)MpiProvideTimeStep,
        .releaseTimestep = MpiReleaseTimeStep,
        .getPriority = MpiGetPriority,
        .destroyReader = MpiDestroyReader,
        .destroyWriter = MpiDestroyWriter,
        .destroyWriterPerReader = MpiDisconnectWriterPerReader,
        .notifyConnFailure = MpiNotifyConnFailure,
    };

    mpiDPInterface.DPName = "mpi";
    return &mpiDPInterface;
}